

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_sse41.c
# Opt level: O2

void blake3_compress_in_place_sse41
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags)

{
  undefined3 in_register_00000011;
  undefined3 in_register_00000081;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar17 = vpinsrb_avx(ZEXT416(CONCAT31(in_register_00000011,block_len)),
                        CONCAT31(in_register_00000081,flags),4);
  auVar15 = *(undefined1 (*) [16])block;
  auVar11 = *(undefined1 (*) [16])(block + 0x10);
  auVar16 = *(undefined1 (*) [16])(block + 0x20);
  auVar18 = *(undefined1 (*) [16])(block + 0x30);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = counter;
  auVar14 = vpunpcklqdq_avx(auVar14,auVar17);
  auVar6 = vshufps_avx(auVar15,auVar11,0x88);
  auVar17 = vpaddd_avx(*(undefined1 (*) [16])(cv + 4),*(undefined1 (*) [16])cv);
  auVar17 = vpaddd_avx(auVar17,auVar6);
  auVar1 = vprold_avx512vl(auVar17 ^ auVar14,0x10);
  auVar14 = vpaddd_avx(auVar1,_DAT_0010c0f0);
  auVar2 = vprold_avx512vl(auVar14 ^ *(undefined1 (*) [16])(cv + 4),0x14);
  auVar13 = vshufps_avx(auVar15,auVar11,0xdd);
  auVar17 = vpaddd_avx(auVar13,auVar17);
  auVar17 = vpaddd_avx(auVar17,auVar2);
  auVar1 = vprold_avx512vl(auVar1 ^ auVar17,0x18);
  auVar14 = vpaddd_avx(auVar14,auVar1);
  auVar3 = vprold_avx512vl(auVar14 ^ auVar2,0x19);
  auVar1 = vpshufd_avx(auVar1,0x4e);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar2 = vshufps_avx(auVar16,auVar18,0x88);
  auVar9 = vshufps_avx(auVar2,auVar2,0x93);
  auVar17 = vpaddd_avx(auVar2,auVar17);
  auVar17 = vpshufd_avx(auVar17,0x93);
  auVar17 = vpaddd_avx(auVar3,auVar17);
  auVar1 = vprold_avx512vl(auVar1 ^ auVar17,0x10);
  auVar14 = vpaddd_avx(auVar14,auVar1);
  auVar2 = vprold_avx512vl(auVar14 ^ auVar3,0x14);
  auVar3 = vshufps_avx(auVar16,auVar18,0x7d);
  auVar8 = vshufps_avx(auVar3,auVar3,0xd2);
  auVar17 = vpaddd_avx(auVar8,auVar17);
  auVar17 = vpaddd_avx(auVar17,auVar2);
  auVar1 = vprold_avx512vl(auVar1 ^ auVar17,0x18);
  auVar14 = vpaddd_avx(auVar14,auVar1);
  auVar4 = vprold_avx512vl(auVar14 ^ auVar2,0x19);
  auVar1 = vpshufd_avx(auVar1,0x4e);
  auVar2 = vpshufd_avx(auVar14,0x93);
  auVar17 = vpshufd_avx(auVar17,0x39);
  auVar14 = vshufps_avx(auVar15,auVar11,0x3e);
  auVar17 = vpaddd_avx(auVar14,auVar17);
  auVar14 = vpaddd_avx(auVar4,auVar17);
  auVar5 = vprold_avx512vl(auVar14 ^ auVar1,0x10);
  auVar1 = vpaddd_avx(auVar2,auVar5);
  auVar2 = vprold_avx512vl(auVar1 ^ auVar4,0x14);
  auVar17 = vinsertps_avx(auVar3,auVar16,0x95);
  auVar3 = vpermi2ps_avx512vl(_DAT_0010c300,auVar6,auVar17);
  auVar14 = vpaddd_avx(auVar14,auVar3);
  auVar14 = vpaddd_avx(auVar14,auVar2);
  auVar6 = vprold_avx512vl(auVar5 ^ auVar14,0x18);
  auVar1 = vpaddd_avx(auVar1,auVar6);
  auVar4 = vprold_avx512vl(auVar1 ^ auVar2,0x19);
  auVar2 = vpshufd_avx(auVar14,0x93);
  auVar6 = vpshufd_avx(auVar6,0x4e);
  auVar1 = vpshufd_avx(auVar1,0x39);
  auVar14 = vmovlhps_avx(auVar8,auVar13);
  auVar5 = vpermi2ps_avx512vl(_DAT_0010c310,auVar14,auVar18);
  auVar14 = vpaddd_avx(auVar2,auVar5);
  auVar14 = vpaddd_avx(auVar14,auVar4);
  auVar7 = vprold_avx512vl(auVar14 ^ auVar6,0x10);
  auVar1 = vpaddd_avx(auVar1,auVar7);
  auVar4 = vprold_avx512vl(auVar1 ^ auVar4,0x14);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x40501));
  auVar2 = vpunpckhdq_avx(auVar13,auVar8);
  auVar8 = vpermt2d_avx512vl(auVar9,auVar6,auVar2);
  auVar14 = vpaddd_avx(auVar14,auVar8);
  auVar14 = vpaddd_avx(auVar14,auVar4);
  auVar2 = vprold_avx512vl(auVar7 ^ auVar14,0x18);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  auVar4 = vprold_avx512vl(auVar1 ^ auVar4,0x19);
  auVar2 = vpshufd_avx(auVar2,0x4e);
  auVar9 = vpshufd_avx(auVar1,0x93);
  auVar13 = vshufps_avx(auVar13,auVar17,0xd7);
  auVar14 = vpaddd_avx(auVar14,auVar13);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar1 = vpaddd_avx(auVar4,auVar14);
  auVar7 = vprold_avx512vl(auVar1 ^ auVar2,0x10);
  auVar2 = vpaddd_avx(auVar9,auVar7);
  auVar9 = vprold_avx512vl(auVar2 ^ auVar4,0x14);
  auVar14 = vinsertps_avx(auVar8,auVar18,0x15);
  auVar4 = vpermi2ps_avx512vl(_DAT_0010c320,auVar15,auVar11);
  auVar11 = vblendps_avx(auVar4,auVar14,10);
  auVar11 = vpaddd_avx(auVar1,auVar11);
  auVar11 = vpaddd_avx(auVar9,auVar11);
  auVar7 = vprold_avx512vl(auVar7 ^ auVar11,0x18);
  auVar1 = vpaddd_avx(auVar2,auVar7);
  auVar10 = vprold_avx512vl(auVar1 ^ auVar9,0x19);
  auVar11 = vpshufd_avx(auVar11,0x93);
  auVar2 = vpshufd_avx(auVar7,0x4e);
  auVar9 = vpshufd_avx(auVar1,0x39);
  auVar1 = vmovlhps_avx512f(auVar8,auVar3);
  auVar7 = vpermt2ps_avx512vl(auVar1,_DAT_0010c230,auVar16);
  auVar11 = vpaddd_avx512vl(auVar11,auVar7);
  auVar1 = vpaddd_avx(auVar11,auVar10);
  auVar3 = vprold_avx512vl(auVar1 ^ auVar2,0x10);
  auVar2 = vpaddd_avx(auVar9,auVar3);
  auVar9 = vprold_avx512vl(auVar2 ^ auVar10,0x14);
  auVar11 = vinsertps_avx(auVar15,auVar8,0x9c);
  auVar5 = vpermt2ps_avx512vl(auVar5,auVar6,auVar11);
  auVar11 = vpaddd_avx(auVar1,auVar5);
  auVar11 = vpaddd_avx(auVar11,auVar9);
  auVar3 = vprold_avx512vl(auVar3 ^ auVar11,0x18);
  auVar1 = vpaddd_avx(auVar2,auVar3);
  auVar10 = vprold_avx512vl(auVar1 ^ auVar9,0x19);
  auVar2 = vpshufd_avx(auVar3,0x4e);
  auVar9 = vpshufd_avx(auVar1,0x93);
  auVar3 = vshufps_avx(auVar17,auVar14,0xd7);
  auVar11 = vpaddd_avx(auVar11,auVar3);
  auVar11 = vpshufd_avx(auVar11,0x39);
  auVar1 = vpaddd_avx(auVar10,auVar11);
  auVar2 = vprold_avx512vl(auVar2 ^ auVar1,0x10);
  auVar12 = vpaddd_avx512vl(auVar9,auVar2);
  auVar11 = vpxord_avx512vl(auVar12,auVar10);
  auVar10 = vprold_avx512vl(auVar11,0x14);
  auVar17 = vinsertps_avx(auVar16,auVar18,0xf5);
  auVar9 = vshufps_avx(auVar13,auVar13,0x18);
  auVar11 = vblendps_avx(auVar9,auVar17,10);
  auVar11 = vpaddd_avx(auVar11,auVar1);
  auVar11 = vpaddd_avx(auVar10,auVar11);
  auVar1 = vprold_avx512vl(auVar2 ^ auVar11,0x18);
  auVar2 = vpaddd_avx512vl(auVar12,auVar1);
  auVar10 = vprold_avx512vl(auVar2 ^ auVar10,0x19);
  auVar11 = vpshufd_avx(auVar11,0x93);
  auVar1 = vpshufd_avx(auVar1,0x4e);
  auVar2 = vpshufd_avx(auVar2,0x39);
  auVar13 = vmovlhps_avx512f(auVar5,auVar4);
  auVar4 = vpermt2d_avx512vl(auVar13,_DAT_0010c230,auVar8);
  auVar11 = vpaddd_avx512vl(auVar11,auVar4);
  auVar11 = vpaddd_avx(auVar10,auVar11);
  auVar13 = vprold_avx512vl(auVar1 ^ auVar11,0x10);
  auVar1 = vpaddd_avx(auVar2,auVar13);
  auVar2 = vprold_avx512vl(auVar1 ^ auVar10,0x14);
  auVar7 = vpermi2ps_avx512vl(_DAT_0010c260,auVar7,auVar15);
  auVar11 = vpaddd_avx(auVar11,auVar7);
  auVar11 = vpaddd_avx(auVar2,auVar11);
  auVar13 = vprold_avx512vl(auVar13 ^ auVar11,0x18);
  auVar1 = vpaddd_avx(auVar1,auVar13);
  auVar8 = vprold_avx512vl(auVar1 ^ auVar2,0x19);
  auVar2 = vpshufd_avx(auVar13,0x4e);
  auVar1 = vpshufd_avx(auVar1,0x93);
  auVar13 = vshufps_avx(auVar14,auVar17,0xd7);
  auVar11 = vpaddd_avx(auVar13,auVar11);
  auVar11 = vpshufd_avx(auVar11,0x39);
  auVar14 = vpaddd_avx(auVar8,auVar11);
  auVar2 = vprold_avx512vl(auVar2 ^ auVar14,0x10);
  auVar1 = vpaddd_avx512vl(auVar1,auVar2);
  auVar10 = vprold_avx512vl(auVar1 ^ auVar8,0x14);
  auVar8 = vinsertps_avx512f(auVar7,auVar4,0x95);
  auVar3 = vshufps_avx(auVar3,auVar3,0x18);
  auVar11 = vblendps_avx(auVar3,auVar8,10);
  auVar11 = vpaddd_avx(auVar11,auVar14);
  auVar11 = vpaddd_avx(auVar10,auVar11);
  auVar14 = vpxorq_avx512vl(auVar2,auVar11);
  auVar2 = vprold_avx512vl(auVar14,0x18);
  auVar14 = vpaddd_avx(auVar1,auVar2);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0x19);
  auVar1 = vpshufd_avx(auVar11,0x93);
  auVar2 = vpshufd_avx(auVar2,0x4e);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar11 = vmovlhps_avx(auVar7,auVar9);
  auVar5 = vpermt2d_avx512vl(auVar11,_DAT_0010c230,auVar5);
  auVar11 = vpaddd_avx(auVar5,auVar1);
  auVar11 = vpaddd_avx(auVar10,auVar11);
  auVar1 = vprold_avx512vl(auVar2 ^ auVar11,0x10);
  auVar14 = vpaddd_avx(auVar14,auVar1);
  auVar2 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar4 = vpermi2ps_avx512vl(_DAT_0010c280,auVar4,auVar15);
  auVar11 = vpaddd_avx(auVar11,auVar4);
  auVar11 = vpaddd_avx(auVar2,auVar11);
  auVar1 = vprold_avx512vl(auVar1 ^ auVar11,0x18);
  auVar14 = vpaddd_avx(auVar14,auVar1);
  auVar2 = vprold_avx512vl(auVar14 ^ auVar2,0x19);
  auVar1 = vpshufd_avx(auVar1,0x4e);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar9 = vshufps_avx(auVar17,auVar8,0xd7);
  auVar11 = vpaddd_avx(auVar9,auVar11);
  auVar11 = vpshufd_avx(auVar11,0x39);
  auVar8 = vpaddd_avx512vl(auVar2,auVar11);
  auVar11 = vpxord_avx512vl(auVar8,auVar1);
  auVar1 = vprold_avx512vl(auVar11,0x10);
  auVar14 = vpaddd_avx(auVar14,auVar1);
  auVar2 = vprold_avx512vl(auVar14 ^ auVar2,0x14);
  auVar17 = vinsertps_avx(auVar4,auVar5,0x95);
  auVar13 = vshufps_avx(auVar13,auVar13,0x18);
  auVar11 = vblendps_avx(auVar13,auVar17,10);
  auVar11 = vpaddd_avx512vl(auVar8,auVar11);
  auVar11 = vpaddd_avx(auVar11,auVar2);
  auVar8 = vprold_avx512vl(auVar1 ^ auVar11,0x18);
  auVar14 = vpaddd_avx(auVar14,auVar8);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar2,0x19);
  auVar1 = vpshufd_avx(auVar11,0x93);
  auVar2 = vpshufd_avx(auVar8,0x4e);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar11 = vmovlhps_avx(auVar4,auVar3);
  auVar3 = vpermt2d_avx512vl(auVar11,_DAT_0010c230,auVar7);
  auVar11 = vpaddd_avx(auVar1,auVar3);
  auVar11 = vpaddd_avx(auVar10,auVar11);
  auVar8 = vprold_avx512vl(auVar2 ^ auVar11,0x10);
  auVar14 = vpaddd_avx(auVar14,auVar8);
  auVar7 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar1._8_8_ = 0x700000002;
  auVar1._0_8_ = 0x700000002;
  auVar15 = vpermi2ps_avx512vl(auVar1,auVar16,auVar15);
  auVar2 = vunpcklps_avx(auVar5,auVar15);
  auVar1 = vshufps_avx(auVar2,auVar2,0x1e);
  auVar15 = vpaddd_avx(auVar11,auVar1);
  auVar15 = vpaddd_avx(auVar7,auVar15);
  auVar16 = vprold_avx512vl(auVar8 ^ auVar15,0x18);
  auVar11 = vpaddd_avx(auVar14,auVar16);
  auVar8 = vprold_avx512vl(auVar11 ^ auVar7,0x19);
  auVar16 = vpshufd_avx(auVar16,0x4e);
  auVar14 = vpshufd_avx(auVar11,0x93);
  auVar15 = vpshufd_avx(auVar15,0x39);
  auVar11 = vpermi2ps_avx512vl(_DAT_0010c2a0,auVar9,auVar17);
  auVar15 = vpaddd_avx(auVar11,auVar15);
  auVar11 = vpaddd_avx(auVar8,auVar15);
  auVar17 = vprold_avx512vl(auVar16 ^ auVar11,0x10);
  auVar16 = vpaddd_avx(auVar14,auVar17);
  auVar14 = vprold_avx512vl(auVar16 ^ auVar8,0x14);
  auVar15 = vinsertps_avx(auVar1,auVar3,0x95);
  auVar15 = vpermi2ps_avx512vl(_DAT_0010c2b0,auVar9,auVar15);
  auVar15 = vpaddd_avx(auVar15,auVar11);
  auVar15 = vpaddd_avx(auVar14,auVar15);
  auVar17 = vprold_avx512vl(auVar17 ^ auVar15,0x18);
  auVar11 = vpaddd_avx(auVar16,auVar17);
  auVar9 = vprold_avx512vl(auVar11 ^ auVar14,0x19);
  auVar16 = vpshufd_avx(auVar15,0x93);
  auVar17 = vpshufd_avx(auVar17,0x4e);
  auVar14 = vpshufd_avx(auVar11,0x39);
  auVar15 = vmovlhps_avx(auVar1,auVar13);
  auVar15 = vpermt2d_avx512vl(auVar15,_DAT_0010c230,auVar4);
  auVar15 = vpaddd_avx(auVar16,auVar15);
  auVar11 = vpaddd_avx(auVar9,auVar15);
  auVar17 = vprold_avx512vl(auVar17 ^ auVar11,0x10);
  auVar16 = vpaddd_avx(auVar14,auVar17);
  auVar14 = vprold_avx512vl(auVar9 ^ auVar16,0x14);
  auVar15 = vblendps_avx(auVar18,auVar2,2);
  auVar15 = vpermt2d_avx512vl(auVar3,auVar6,auVar15);
  auVar15 = vpaddd_avx(auVar15,auVar11);
  auVar15 = vpaddd_avx(auVar15,auVar14);
  auVar18 = vprold_avx512vl(auVar17 ^ auVar15,0x18);
  auVar11 = vpaddd_avx(auVar16,auVar18);
  auVar17 = vprold_avx512vl(auVar11 ^ auVar14,0x19);
  auVar15 = vpshufd_avx(auVar15,0x39);
  auVar16 = vpshufd_avx(auVar18,0x4e);
  auVar11 = vpshufd_avx(auVar11,0x93);
  *(undefined1 (*) [16])cv = auVar11 ^ auVar15;
  *(undefined1 (*) [16])(cv + 4) = auVar17 ^ auVar16;
  return;
}

Assistant:

INLINE __m128i loadu(const uint8_t src[16]) {
  return _mm_loadu_si128((const __m128i *)src);
}